

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

void ssl_calc_finished_tls_sha256(mbedtls_ssl_context *ssl,uchar *buf,int from)

{
  long lVar1;
  char *pcVar2;
  mbedtls_ssl_session *pmVar3;
  uchar padbuf [32];
  mbedtls_sha256_context sha256;
  uchar local_c8 [44];
  mbedtls_sha256_context local_9c;
  
  pmVar3 = ssl->session_negotiate;
  if (pmVar3 == (mbedtls_ssl_session *)0x0) {
    pmVar3 = ssl->session;
  }
  mbedtls_sha256_init(&local_9c);
  mbedtls_sha256_clone(&local_9c,&ssl->handshake->fin_sha256);
  pcVar2 = "server finished";
  if (from == 0) {
    pcVar2 = "client finished";
  }
  mbedtls_sha256_finish_ret(&local_9c,local_c8);
  (*ssl->handshake->tls_prf)(pmVar3->master,0x30,pcVar2,local_c8,0x20,buf,0xc);
  mbedtls_sha256_free(&local_9c);
  lVar1 = 0;
  do {
    local_c8[lVar1] = '\0';
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x20);
  return;
}

Assistant:

static void ssl_calc_finished_tls_sha256(
                mbedtls_ssl_context *ssl, unsigned char *buf, int from )
{
    int len = 12;
    const char *sender;
    mbedtls_sha256_context sha256;
    unsigned char padbuf[32];

    mbedtls_ssl_session *session = ssl->session_negotiate;
    if( !session )
        session = ssl->session;

    mbedtls_sha256_init( &sha256 );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc  finished tls sha256" ) );

    mbedtls_sha256_clone( &sha256, &ssl->handshake->fin_sha256 );

    /*
     * TLSv1.2:
     *   hash = PRF( master, finished_label,
     *               Hash( handshake ) )[0.11]
     */

#if !defined(MBEDTLS_SHA256_ALT)
    MBEDTLS_SSL_DEBUG_BUF( 4, "finished sha2 state", (unsigned char *)
                   sha256.state, sizeof( sha256.state ) );
#endif

    sender = ( from == MBEDTLS_SSL_IS_CLIENT )
             ? "client finished"
             : "server finished";

    mbedtls_sha256_finish_ret( &sha256, padbuf );

    ssl->handshake->tls_prf( session->master, 48, sender,
                             padbuf, 32, buf, len );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calc finished result", buf, len );

    mbedtls_sha256_free( &sha256 );

    mbedtls_zeroize(  padbuf, sizeof(  padbuf ) );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc  finished" ) );
}